

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void deqp::gls::FboUtil::logFramebufferConfig(Framebuffer *cfg,TestLog *log)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  TestLog *log_00;
  GLenum GVar3;
  _Base_ptr p_Var4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  char *pcVar9;
  _Self __tmp;
  _Alloc_hider _Var10;
  string attDesc;
  ScopedLogSection subsection;
  ostringstream s;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  Framebuffer *local_1e0;
  TestLog *local_1d8;
  _Rb_tree_node_base *local_1d0;
  string local_1c8;
  LogSection local_1a8;
  ios_base local_138 [264];
  
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_1e0 = cfg;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Framebuffer","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"Framebuffer configuration","");
  tcu::LogSection::LogSection(&local_1a8,&local_240,&local_220);
  tcu::TestLog::startSection
            (log,local_1a8.m_name._M_dataplus._M_p,local_1a8.m_description._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_description._M_dataplus._M_p != &local_1a8.m_description.field_2) {
    operator_delete(local_1a8.m_description._M_dataplus._M_p,
                    local_1a8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
    operator_delete(local_1a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                      CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                               CONCAT14(local_1a8.m_name.field_2._M_local_buf[4],
                                                        local_1a8.m_name.field_2.
                                                        _M_allocated_capacity._0_4_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  local_1d8 = log;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT17(local_240.field_2._M_local_buf[7],
                             CONCAT16(local_240.field_2._M_local_buf[6],
                                      CONCAT15(local_240.field_2._M_local_buf[5],
                                               CONCAT14(local_240.field_2._M_local_buf[4],
                                                        local_240.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  p_Var4 = (local_1e0->rbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d0 = &(local_1e0->rbos)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != local_1d0) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+(&local_1a8.m_name,"Renderbuffer ",&local_200);
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_1c8,local_1d8,&local_200,&local_1a8.m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
        operator_delete(local_1a8.m_name._M_dataplus._M_p,
                        CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                          CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8.m_name.field_2._M_local_buf[4]
                                                            ,local_1a8.m_name.field_2.
                                                             _M_allocated_capacity._0_4_)))) + 1);
      }
      p_Var1 = p_Var4[1]._M_parent;
      logImage((Image *)p_Var1,local_1d8,false);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_240.field_2._M_local_buf[4] = 'l';
      local_240.field_2._M_local_buf[5] = 'e';
      local_240.field_2._M_local_buf[6] = 's';
      local_240.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
      local_240._M_string_length = 7;
      local_240.field_2._M_local_buf[7] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<(&local_1a8,*(int *)&p_Var1->_M_right);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      logField(local_1d8,&local_240,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      tcu::TestLog::endSection((TestLog *)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_1d0);
  }
  log_00 = local_1d8;
  p_Var4 = (local_1e0->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d0 = &(local_1e0->textures)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != local_1d0) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+(&local_1a8.m_name,"Texture ",&local_200);
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_1c8,log_00,&local_200,&local_1a8.m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
        operator_delete(local_1a8.m_name._M_dataplus._M_p,
                        CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                          CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8.m_name.field_2._M_local_buf[4]
                                                            ,local_1a8.m_name.field_2.
                                                             _M_allocated_capacity._0_4_)))) + 1);
      }
      p_Var1 = p_Var4[1]._M_parent;
      local_1a8.m_name._M_dataplus._M_p = (pointer)&local_1a8.m_name.field_2;
      local_1a8.m_name.field_2._M_allocated_capacity._0_4_ = 0x65707954;
      local_1a8.m_name._M_string_length = 4;
      local_1a8.m_name.field_2._M_local_buf[4] = '\0';
      GVar3 = config::glTarget((Image *)p_Var1);
      pcVar5 = glu::getTextureTargetName(GVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,pcVar5,(allocator<char> *)&local_220);
      logField(log_00,&local_1a8.m_name,&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
        operator_delete(local_1a8.m_name._M_dataplus._M_p,
                        CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                          CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8.m_name.field_2._M_local_buf[4]
                                                            ,local_1a8.m_name.field_2.
                                                             _M_allocated_capacity._0_4_)))) + 1);
      }
      logImage((Image *)p_Var1,log_00,true);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_240.field_2._M_local_buf[4] = 'l';
      local_240.field_2._M_local_buf[5] = 's';
      local_240.field_2._M_allocated_capacity._0_4_ = 0x6576654c;
      local_240._M_string_length = 6;
      local_240.field_2._M_local_buf[6] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<(&local_1a8,*(int *)&p_Var1->_M_right);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      logField(log_00,&local_240,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      lVar6 = __dynamic_cast(p_Var1,&config::Texture::typeinfo,&config::TextureLayered::typeinfo,0);
      if (lVar6 != 0) {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_240.field_2._M_local_buf[4] = 'r';
        local_240.field_2._M_local_buf[5] = 's';
        local_240.field_2._M_allocated_capacity._0_4_ = 0x6579614c;
        local_240._M_string_length = 6;
        local_240.field_2._M_local_buf[6] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<(&local_1a8,*(int *)(lVar6 + 0x1c));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        logField(log_00,&local_240,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT17(local_240.field_2._M_local_buf[7],
                                   CONCAT16(local_240.field_2._M_local_buf[6],
                                            CONCAT15(local_240.field_2._M_local_buf[5],
                                                     CONCAT14(local_240.field_2._M_local_buf[4],
                                                              local_240.field_2.
                                                              _M_allocated_capacity._0_4_)))) + 1);
        }
      }
      tcu::TestLog::endSection((TestLog *)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_1d0);
  }
  sVar2 = (local_1e0->attachments)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar5 = "Framebuffer attachments";
  if (sVar2 == 0) {
    pcVar5 = "Framebuffer has no attachments";
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  pcVar9 = pcVar5 + 0x17;
  if (sVar2 == 0) {
    pcVar9 = pcVar5 + 0x1e;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,pcVar5,pcVar9);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Attachments","");
  tcu::LogSection::LogSection(&local_1a8,&local_240,&local_200);
  tcu::TestLog::startSection
            (log_00,local_1a8.m_name._M_dataplus._M_p,local_1a8.m_description._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_description._M_dataplus._M_p != &local_1a8.m_description.field_2) {
    operator_delete(local_1a8.m_description._M_dataplus._M_p,
                    local_1a8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
    operator_delete(local_1a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                      CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                               CONCAT14(local_1a8.m_name.field_2._M_local_buf[4],
                                                        local_1a8.m_name.field_2.
                                                        _M_allocated_capacity._0_4_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT17(local_240.field_2._M_local_buf[7],
                             CONCAT16(local_240.field_2._M_local_buf[6],
                                      CONCAT15(local_240.field_2._M_local_buf[5],
                                               CONCAT14(local_240.field_2._M_local_buf[4],
                                                        local_240.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  p_Var8 = (local_1e0->attachments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e0 = (Framebuffer *)&(local_1e0->attachments)._M_t._M_impl.super__Rb_tree_header;
  if ((Framebuffer *)p_Var8 != local_1e0) {
    do {
      pcVar5 = glu::getFramebufferAttachmentName(p_Var8[1]._M_color);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,pcVar5,(allocator<char> *)&local_1a8);
      std::operator+(&local_240,"Attachment point ",&local_1c8);
      tcu::LogSection::LogSection(&local_1a8,&local_1c8,&local_240);
      tcu::TestLog::startSection
                (log_00,local_1a8.m_name._M_dataplus._M_p,local_1a8.m_description._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_description._M_dataplus._M_p != &local_1a8.m_description.field_2) {
        operator_delete(local_1a8.m_description._M_dataplus._M_p,
                        local_1a8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
        operator_delete(local_1a8.m_name._M_dataplus._M_p,
                        CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                          CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8.m_name.field_2._M_local_buf[4]
                                                            ,local_1a8.m_name.field_2.
                                                             _M_allocated_capacity._0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      p_Var4 = p_Var8[1]._M_parent;
      local_1a8.m_name._M_dataplus._M_p = (pointer)&local_1a8.m_name.field_2;
      local_1a8.m_name.field_2._M_local_buf[4] = 'e';
      local_1a8.m_name.field_2._M_local_buf[5] = 't';
      local_1a8.m_name.field_2._M_allocated_capacity._0_4_ = 0x67726154;
      local_1a8.m_name._M_string_length = 6;
      local_1a8.m_name.field_2._M_local_buf[6] = '\0';
      pcVar5 = glu::getFramebufferTargetName(*(GLenum *)&p_Var4->_M_parent);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,pcVar5,(allocator<char> *)&local_220);
      logField(log_00,&local_1a8.m_name,&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
        operator_delete(local_1a8.m_name._M_dataplus._M_p,
                        CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                          CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8.m_name.field_2._M_local_buf[4]
                                                            ,local_1a8.m_name.field_2.
                                                             _M_allocated_capacity._0_4_)))) + 1);
      }
      local_1a8.m_name._M_dataplus._M_p = (pointer)&local_1a8.m_name.field_2;
      local_1a8.m_name.field_2._M_allocated_capacity._0_4_ = 0x65707954;
      local_1a8.m_name._M_string_length = 4;
      local_1a8.m_name.field_2._M_local_buf[4] = '\0';
      GVar3 = config::attachmentType((Attachment *)p_Var4);
      pcVar5 = glu::getFramebufferAttachmentTypeName(GVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,pcVar5,(allocator<char> *)&local_220);
      logField(log_00,&local_1a8.m_name,&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
        operator_delete(local_1a8.m_name._M_dataplus._M_p,
                        CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                          CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8.m_name.field_2._M_local_buf[4]
                                                            ,local_1a8.m_name.field_2.
                                                             _M_allocated_capacity._0_4_)))) + 1);
      }
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_240.field_2._M_allocated_capacity._0_4_ = 0x67616d49;
      local_240.field_2._M_local_buf[4] = 'e';
      local_240.field_2._M_local_buf[5] = ' ';
      local_240.field_2._M_local_buf[6] = 'N';
      local_240.field_2._M_local_buf[7] = 'a';
      local_240.field_2._8_2_ = 0x656d;
      local_240._M_string_length = 10;
      local_240.field_2._M_local_buf[10] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      logField(log_00,&local_240,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        CONCAT17(local_240.field_2._M_local_buf[7],
                                 CONCAT16(local_240.field_2._M_local_buf[6],
                                          CONCAT15(local_240.field_2._M_local_buf[5],
                                                   CONCAT14(local_240.field_2._M_local_buf[4],
                                                            local_240.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      lVar6 = __dynamic_cast(p_Var4,&config::Attachment::typeinfo,
                             &config::RenderbufferAttachment::typeinfo,0);
      if (lVar6 == 0) {
        lVar6 = __dynamic_cast(p_Var4,&config::Attachment::typeinfo,
                               &config::TextureAttachment::typeinfo,0);
        if (lVar6 != 0) {
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          local_240.field_2._M_allocated_capacity._0_4_ = 0x6d70694d;
          local_240.field_2._M_local_buf[4] = 'a';
          local_240.field_2._M_local_buf[5] = 'p';
          local_240.field_2._M_local_buf[6] = ' ';
          local_240.field_2._M_local_buf[7] = 'L';
          local_240.field_2._8_2_ = 0x7665;
          local_240.field_2._M_local_buf[10] = 'e';
          local_240.field_2._M_local_buf[0xb] = 'l';
          local_240._M_string_length = 0xc;
          local_240.field_2._M_local_buf[0xc] = '\0';
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<(&local_1a8,*(int *)(lVar6 + 0x10));
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          logField(log_00,&local_240,&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,
                            CONCAT17(local_240.field_2._M_local_buf[7],
                                     CONCAT16(local_240.field_2._M_local_buf[6],
                                              CONCAT15(local_240.field_2._M_local_buf[5],
                                                       CONCAT14(local_240.field_2._M_local_buf[4],
                                                                local_240.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
          }
          lVar7 = __dynamic_cast(lVar6,&config::TextureAttachment::typeinfo,
                                 &config::TextureFlatAttachment::typeinfo,0);
          if (lVar7 != 0) {
            local_1a8.m_name._M_dataplus._M_p = (pointer)&local_1a8.m_name.field_2;
            local_1a8.m_name.field_2._8_6_ = 0x746567726154;
            local_1a8.m_name.field_2._M_allocated_capacity._0_4_ = 0x74786554;
            local_1a8.m_name.field_2._M_local_buf[4] = 'u';
            local_1a8.m_name.field_2._M_local_buf[5] = 'r';
            local_1a8.m_name.field_2._M_local_buf[6] = 'e';
            local_1a8.m_name.field_2._M_local_buf[7] = ' ';
            local_1a8.m_name._M_string_length = 0xe;
            local_1a8.m_name.field_2._M_local_buf[0xe] = '\0';
            pcVar5 = glu::getTextureTargetName(*(int *)(lVar7 + 0x14));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_240,pcVar5,(allocator<char> *)&local_220);
            logField(log_00,&local_1a8.m_name,&local_240);
            goto LAB_008dc828;
          }
          lVar6 = __dynamic_cast(lVar6,&config::TextureAttachment::typeinfo,
                                 &config::TextureLayerAttachment::typeinfo,0);
          if (lVar6 != 0) {
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
            local_240.field_2._M_local_buf[4] = 'r';
            local_240.field_2._M_allocated_capacity._0_4_ = 0x6579614c;
            local_240._M_string_length = 5;
            local_240.field_2._M_local_buf[5] = '\0';
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::ostream::operator<<(&local_1a8,*(int *)(lVar6 + 0x10));
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            logField(log_00,&local_240,&local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              lVar6 = CONCAT17(local_240.field_2._M_local_buf[7],
                               CONCAT16(local_240.field_2._M_local_buf[6],
                                        CONCAT15(local_240.field_2._M_local_buf[5],
                                                 CONCAT14(local_240.field_2._M_local_buf[4],
                                                          local_240.field_2._M_allocated_capacity.
                                                          _0_4_))));
              _Var10._M_p = local_240._M_dataplus._M_p;
              goto LAB_008dc860;
            }
          }
        }
      }
      else {
        local_1a8.m_name._M_dataplus._M_p = (pointer)&local_1a8.m_name.field_2;
        local_240._M_dataplus._M_p = (pointer)0x13;
        local_1a8.m_name._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_240);
        local_1a8.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_240._M_dataplus._M_p,0);
        local_1a8.m_name.field_2._M_local_buf[4] = (char)((ulong)local_240._M_dataplus._M_p >> 0x20)
        ;
        local_1a8.m_name.field_2._M_local_buf[5] = (char)((ulong)local_240._M_dataplus._M_p >> 0x28)
        ;
        local_1a8.m_name.field_2._M_local_buf[6] = (char)((ulong)local_240._M_dataplus._M_p >> 0x30)
        ;
        local_1a8.m_name.field_2._M_local_buf[7] = (char)((ulong)local_240._M_dataplus._M_p >> 0x38)
        ;
        *(undefined8 *)local_1a8.m_name._M_dataplus._M_p = 0x75627265646e6552;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 8) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 9) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0xb) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0xc) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0xd) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0xe) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0xf) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0xf) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0x10) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8.m_name._M_dataplus._M_p + 0x12) = 't';
        local_1a8.m_name._M_string_length = (size_type)local_240._M_dataplus._M_p;
        local_1a8.m_name._M_dataplus._M_p[(long)local_240._M_dataplus._M_p] = '\0';
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_240.field_2._8_2_ = 0x4252;
        local_240.field_2._M_local_buf[10] = 'U';
        local_240.field_2._M_local_buf[0xb] = 'F';
        local_240.field_2._M_local_buf[0xc] = 'F';
        local_240.field_2._13_2_ = 0x5245;
        local_240.field_2._M_allocated_capacity._0_4_ = 0x525f4c47;
        local_240.field_2._M_local_buf[4] = 'E';
        local_240.field_2._M_local_buf[5] = 'N';
        local_240.field_2._M_local_buf[6] = 'D';
        local_240.field_2._M_local_buf[7] = 'E';
        local_240._M_string_length = 0xf;
        local_240.field_2._M_local_buf[0xf] = '\0';
        logField(log_00,&local_1a8.m_name,&local_240);
LAB_008dc828:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,
                          CONCAT17(local_240.field_2._M_local_buf[7],
                                   CONCAT16(local_240.field_2._M_local_buf[6],
                                            CONCAT15(local_240.field_2._M_local_buf[5],
                                                     CONCAT14(local_240.field_2._M_local_buf[4],
                                                              local_240.field_2.
                                                              _M_allocated_capacity._0_4_)))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
          lVar6 = CONCAT17(local_1a8.m_name.field_2._M_local_buf[7],
                           CONCAT16(local_1a8.m_name.field_2._M_local_buf[6],
                                    CONCAT15(local_1a8.m_name.field_2._M_local_buf[5],
                                             CONCAT14(local_1a8.m_name.field_2._M_local_buf[4],
                                                      local_1a8.m_name.field_2._M_allocated_capacity
                                                      ._0_4_))));
          _Var10._M_p = local_1a8.m_name._M_dataplus._M_p;
LAB_008dc860:
          operator_delete(_Var10._M_p,lVar6 + 1);
        }
      }
      tcu::TestLog::endSection(log_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((Framebuffer *)p_Var8 != local_1e0);
  }
  tcu::TestLog::endSection(log_00);
  tcu::TestLog::endSection(log_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void logFramebufferConfig (const Framebuffer& cfg, TestLog& log)
{
	log << TestLog::Section("Framebuffer", "Framebuffer configuration");

	for (RboMap::const_iterator it = cfg.rbos.begin(); it != cfg.rbos.end(); ++it)
	{
		const string				num			= toString(it->first);
		const tcu::ScopedLogSection	subsection	(log, num, "Renderbuffer " + num);

		logRenderbuffer(*it->second, log);
	}

	for (TextureMap::const_iterator it = cfg.textures.begin();
		it != cfg.textures.end(); ++it)
	{
		const string				num			= toString(it->first);
		const tcu::ScopedLogSection	subsection	(log, num, "Texture " + num);

		logTexture(*it->second, log);
	}

	const string attDesc = cfg.attachments.empty()
		? "Framebuffer has no attachments"
		: "Framebuffer attachments";
	log << TestLog::Section("Attachments", attDesc);
	for (AttachmentMap::const_iterator it = cfg.attachments.begin();
		 it != cfg.attachments.end(); it++)
	{
		const string attPointName = getFramebufferAttachmentName(it->first);
		log << TestLog::Section(attPointName, "Attachment point " + attPointName);
		logAttachment(*it->second, log);
		log << TestLog::EndSection;
	}
	log << TestLog::EndSection; // Attachments

	log << TestLog::EndSection; // Framebuffer
}